

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_encode_sb(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  byte bVar1;
  byte bVar2;
  int subsampling_y_00;
  BLOCK_SIZE BVar3;
  BLOCK_SIZE BVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  AV1_COMMON *cm_00;
  long lVar9;
  byte in_CL;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  int unit_width;
  int unit_height;
  int blk_col;
  int blk_row;
  int idx;
  int idy;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  int step;
  int block;
  int bh;
  int bw;
  BLOCK_SIZE txb_size;
  TX_SIZE max_tx_size;
  int mi_height;
  int mi_width;
  BLOCK_SIZE plane_bsize;
  int subsampling_y;
  int subsampling_x;
  macroblockd_plane *pd;
  int plane;
  int num_planes;
  AV1_COMMON *cm;
  encode_b_args arg;
  optimize_ctx ctx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  ENTROPY_CONTEXT *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  MACROBLOCKD *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe74;
  uint uVar10;
  uint local_188;
  uint local_184;
  uint local_180;
  int local_174;
  int local_170;
  int local_16c;
  int in_stack_fffffffffffffe98;
  int iVar11;
  uint in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int local_128;
  undefined1 *arg_00;
  undefined1 *puVar12;
  undefined1 local_e8 [96];
  undefined1 auStack_88 [96];
  long local_28;
  long local_20;
  byte local_12;
  BLOCK_SIZE local_11;
  
  local_20 = in_RSI + 0x1a0;
  local_28 = **(long **)(in_RSI + 0x2058);
  *(undefined1 *)(local_28 + 0x90) = 1;
  if (*(char *)(in_RSI + 0x24e08) == '\0') {
    cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
    local_12 = in_CL;
    local_11 = in_DL;
    iVar5 = av1_num_planes(cm_00);
    for (local_128 = 0; BVar4 = (BLOCK_SIZE)(in_stack_fffffffffffffe9c >> 0x18), local_128 < iVar5;
        local_128 = local_128 + 1) {
      lVar9 = local_20 + 0x10 + (long)local_128 * 0xa30;
      iVar11 = *(int *)(lVar9 + 4);
      subsampling_y_00 = *(int *)(lVar9 + 8);
      if ((local_128 != 0) && ((*(byte *)(local_20 + 0xc) & 1) == 0)) {
        return;
      }
      BVar3 = get_plane_block_size(local_11,iVar11,subsampling_y_00);
      uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar3];
      uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [BVar3];
      iVar8 = get_vartx_max_txsize
                        (in_stack_fffffffffffffe68,
                         (BLOCK_SIZE)((uint)in_stack_fffffffffffffe64 >> 0x18),
                         in_stack_fffffffffffffe60);
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [txsize_to_bsize[(byte)iVar8]];
      bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [txsize_to_bsize[(byte)iVar8]];
      av1_get_entropy_contexts
                ((BLOCK_SIZE)(in_stack_fffffffffffffe74 >> 0x18),
                 (macroblockd_plane *)in_stack_fffffffffffffe68,
                 (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      av1_subtract_plane((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                         ,BVar4,in_stack_fffffffffffffe98);
      arg_00 = local_e8 + (long)local_128 * 0x20;
      puVar12 = auStack_88 + (long)local_128 * 0x20;
      BVar4 = get_plane_block_size(BLOCK_64X64,iVar11,subsampling_y_00);
      in_stack_fffffffffffffea4 = CONCAT13(BVar4,(int3)in_stack_fffffffffffffea4);
      local_180 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [BVar4];
      local_184 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [BVar4];
      if (uVar6 < local_180) {
        local_180 = uVar6;
      }
      if (uVar7 < local_184) {
        local_184 = uVar7;
      }
      in_stack_fffffffffffffe98 = 0;
      while (in_stack_fffffffffffffe98 < (int)uVar7) {
        local_170 = in_stack_fffffffffffffe98;
        for (local_16c = 0; local_16c < (int)uVar6; local_16c = local_180 + local_16c) {
          local_188 = uVar7;
          if ((int)(local_184 + local_170) < (int)uVar7) {
            local_188 = local_184 + local_170;
          }
          in_stack_fffffffffffffe74 = uVar6;
          iVar11 = local_170;
          uVar10 = uVar6;
          if ((int)(local_180 + local_16c) < (int)uVar6) {
            in_stack_fffffffffffffe74 = local_180 + local_16c;
            uVar10 = local_180 + local_16c;
          }
          for (; local_170 < (int)local_188; local_170 = (uint)bVar2 + local_170) {
            for (local_174 = local_16c; local_174 < (int)uVar10; local_174 = (uint)bVar1 + local_174
                ) {
              in_stack_fffffffffffffe58 = &stack0xfffffffffffffee8;
              in_stack_fffffffffffffe60 = (uint)local_12;
              encode_block_inter((int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                                 (BLOCK_SIZE)((ulong)cm_00 >> 0x38),(TX_SIZE)((ulong)cm_00 >> 0x30),
                                 arg_00,(RUN_TYPE)puVar12);
            }
          }
          local_170 = iVar11;
        }
        in_stack_fffffffffffffe98 = local_184 + local_170;
      }
      in_stack_fffffffffffffe9c = local_184;
      in_stack_fffffffffffffea0 = local_180;
    }
  }
  return;
}

Assistant:

void av1_encode_sb(const struct AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                   RUN_TYPE dry_run) {
  assert(bsize < BLOCK_SIZES_ALL);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // In the current encoder implementation, for inter blocks,
  // only when YUV planes all have zero quantized transform coefficients,
  // mbmi->skip_txfm flag is set to 1.
  // For intra blocks, this flag is set to 0 since skipped blocks are so rare
  // that transmitting skip_txfm = 1 is very expensive.
  // mbmi->skip_txfm is init to 1, and will be modified in encode_block() based
  // on transform, quantization, and (if exists) trellis optimization.
  mbmi->skip_txfm = 1;
  if (x->txfm_search_info.skip_txfm) return;

  struct optimize_ctx ctx;
  struct encode_b_args arg = {
    cpi, x, &ctx, NULL, NULL, dry_run, cpi->optimize_seg_arr[mbmi->segment_id]
  };
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int subsampling_x = pd->subsampling_x;
    const int subsampling_y = pd->subsampling_y;
    if (plane && !xd->is_chroma_ref) break;
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, subsampling_x, subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int mi_width = mi_size_wide[plane_bsize];
    const int mi_height = mi_size_high[plane_bsize];
    const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
    const BLOCK_SIZE txb_size = txsize_to_bsize[max_tx_size];
    const int bw = mi_size_wide[txb_size];
    const int bh = mi_size_high[txb_size];
    int block = 0;
    const int step =
        tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
    av1_get_entropy_contexts(plane_bsize, pd, ctx.ta[plane], ctx.tl[plane]);
    av1_subtract_plane(x, plane_bsize, plane);
    arg.ta = ctx.ta[plane];
    arg.tl = ctx.tl[plane];
    const BLOCK_SIZE max_unit_bsize =
        get_plane_block_size(BLOCK_64X64, subsampling_x, subsampling_y);
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];
    mu_blocks_wide = AOMMIN(mi_width, mu_blocks_wide);
    mu_blocks_high = AOMMIN(mi_height, mu_blocks_high);

    for (int idy = 0; idy < mi_height; idy += mu_blocks_high) {
      for (int idx = 0; idx < mi_width; idx += mu_blocks_wide) {
        int blk_row, blk_col;
        const int unit_height = AOMMIN(mu_blocks_high + idy, mi_height);
        const int unit_width = AOMMIN(mu_blocks_wide + idx, mi_width);
        for (blk_row = idy; blk_row < unit_height; blk_row += bh) {
          for (blk_col = idx; blk_col < unit_width; blk_col += bw) {
            encode_block_inter(plane, block, blk_row, blk_col, plane_bsize,
                               max_tx_size, &arg, dry_run);
            block += step;
          }
        }
      }
    }
  }
}